

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blip_Buffer.cpp
# Opt level: O3

void __thiscall Blip_Synth_::adjust_impulse(Blip_Synth_ *this)

{
  int iVar1;
  int iVar2;
  short *psVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  short *psVar8;
  short *psVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  short sVar13;
  
  iVar1 = this->width;
  lVar5 = (long)iVar1 * 0x20;
  iVar2 = this->kernel_unit;
  psVar3 = this->impulses;
  psVar9 = psVar3 + 0x40;
  iVar10 = 0x40;
  psVar8 = psVar3;
  uVar11 = 0x3f;
  do {
    lVar12 = (long)iVar2;
    if (0 < iVar1) {
      lVar6 = 0;
      do {
        lVar12 = lVar12 - ((long)psVar8[lVar6] + (long)psVar9[lVar6]);
        lVar7 = lVar6 + 0x41;
        lVar6 = lVar6 + 0x40;
      } while (lVar7 <= lVar5);
    }
    sVar13 = (short)((uint)((int)lVar12 - (int)(lVar12 >> 0x3f)) >> 1);
    if (uVar11 != 0x3f - iVar10) {
      sVar13 = (short)lVar12;
    }
    psVar3[(long)(int)lVar5 + (uVar11 - 0x3f)] = psVar3[(long)(int)lVar5 + (uVar11 - 0x3f)] + sVar13
    ;
    iVar10 = iVar10 + -1;
    psVar8 = psVar8 + 1;
    psVar9 = psVar9 + -1;
    bVar4 = 0x1f < uVar11;
    uVar11 = uVar11 - 1;
  } while (bVar4);
  return;
}

Assistant:

void Blip_Buffer::remove_samples( long count )
{
	if ( count )
	{
		remove_silence( count );
		
		// copy remaining samples to beginning and clear old samples
		long remain = samples_avail() + blip_buffer_extra_;
		memmove( buffer_, buffer_ + count, remain * sizeof *buffer_ );
		memset( buffer_ + remain, 0, count * sizeof *buffer_ );
	}
}